

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Type.cxx
# Opt level: O0

void __thiscall Fl_Type::add(Fl_Type *this,Fl_Type *p)

{
  bool bVar1;
  Fl_Type *local_38;
  Fl_Type *t;
  Fl_Type *pFStack_28;
  int newlevel;
  Fl_Type *q;
  Fl_Type *end;
  Fl_Type *p_local;
  Fl_Type *this_local;
  
  if ((p == (Fl_Type *)0x0) || (this->parent != p)) {
    undo_checkpoint();
    this->parent = p;
    for (q = this; q->next != (Fl_Type *)0x0; q = q->next) {
    }
    if (p == (Fl_Type *)0x0) {
      pFStack_28 = (Fl_Type *)0x0;
      t._4_4_ = 0;
    }
    else {
      pFStack_28 = p->next;
      while( true ) {
        bVar1 = false;
        if (pFStack_28 != (Fl_Type *)0x0) {
          bVar1 = p->level < pFStack_28->level;
        }
        if (!bVar1) break;
        pFStack_28 = pFStack_28->next;
      }
      t._4_4_ = p->level + 1;
    }
    for (local_38 = this->next; local_38 != (Fl_Type *)0x0; local_38 = local_38->next) {
      local_38->level = (t._4_4_ - this->level) + local_38->level;
    }
    this->level = t._4_4_;
    if (pFStack_28 == (Fl_Type *)0x0) {
      if (first == (Fl_Type *)0x0) {
        last = q;
        first = this;
        q->next = (Fl_Type *)0x0;
        this->prev = (Fl_Type *)0x0;
      }
      else {
        this->prev = last;
        this->prev->next = this;
        q->next = (Fl_Type *)0x0;
        last = q;
      }
    }
    else {
      this->prev = pFStack_28->prev;
      this->prev->next = this;
      pFStack_28->prev = q;
      q->next = pFStack_28;
    }
    if (p != (Fl_Type *)0x0) {
      (*p->_vptr_Fl_Type[8])(p,this,0);
    }
    this->open_ = '\x01';
    fixvisible(this);
    set_modflag(1);
    Fl_Widget::redraw((Fl_Widget *)widget_browser);
  }
  return;
}

Assistant:

void Fl_Type::add(Fl_Type *p) {
  if (p && parent == p) return;
  undo_checkpoint();
  parent = p;
  Fl_Type *end = this;
  while (end->next) end = end->next;
  Fl_Type *q;
  int newlevel;
  if (p) {
    for (q = p->next; q && q->level > p->level; q = q->next) {/*empty*/}
    newlevel = p->level+1;
  } else {
    q = 0;
    newlevel = 0;
  }
  for (Fl_Type *t = this->next; t; t = t->next) t->level += (newlevel-level);
  level = newlevel;
  if (q) {
    prev = q->prev;
    prev->next = this;
    q->prev = end;
    end->next = q;
  } else if (first) {
    prev = last;
    prev->next = this;
    end->next = 0;
    last = end;
  } else {
    first = this;
    last = end;
    prev = end->next = 0;
  }
  if (p) p->add_child(this,0);
  open_ = 1;
  fixvisible(this);
  set_modflag(1);
  widget_browser->redraw();
}